

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capture.cpp
# Opt level: O0

void __thiscall
CaptureETCaptureRValueRight::~CaptureETCaptureRValueRight(CaptureETCaptureRValueRight *this)

{
  CaptureETCaptureRValueRight *this_local;
  
  ~CaptureETCaptureRValueRight(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

DEF_TEST(ETCaptureRValueRight, Capture)
{
  testinator::TestRegistry r;
  ostringstream oss;
  std::unique_ptr<testinator::Outputter> op =
    make_unique<testinator::DefaultOutputter>(oss);

  TestETCaptureRValueRight myTestA(r, "A");
  testinator::Results rs = r.RunAllTests(testinator::RunParams(), op.get());

  static string expected = "0 == 1";
  return oss.str().find(expected) != string::npos;
}